

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int buffer_insert(BUFFER *buf,size_t off,void *data,size_t n)

{
  void *__dest;
  BUFFER *in_RCX;
  void *in_RDX;
  void *ptr;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  __dest = buffer_insert_raw(in_RCX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (__dest == (void *)0x0) {
    local_4 = -1;
  }
  else {
    memcpy(__dest,in_RDX,(size_t)in_RCX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
buffer_insert(BUFFER* buf, size_t off, const void* data, size_t n)
{
    void* ptr;

    ptr = buffer_insert_raw(buf, off, n);
    if(ptr == NULL)
        return -1;

    memcpy(ptr, data, n);
    return 0;
}